

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)9>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *xn,xpath_allocator *alloc)

{
  bool bVar1;
  uint uVar2;
  xml_node_struct *pxVar3;
  xpath_node xStack_28;
  
  pxVar3 = (xml_node_struct *)*xn;
  if (pxVar3 == (xml_node_struct *)0x0 || xn[1] != 0) {
    if (pxVar3 == (xml_node_struct *)0x0 || xn[1] == 0) {
      return;
    }
  }
  else {
    pxVar3 = pxVar3->parent;
    if (pxVar3 == (xml_node_struct *)0x0) {
      return;
    }
  }
  if (7 < (byte)this->_test - 1) {
    return;
  }
  uVar2 = (uint)pxVar3->header & 0xf;
  switch((uint)(byte)this->_test) {
  case 1:
    if (uVar2 != 2) {
      return;
    }
    goto LAB_0011f4c8;
  case 3:
    if (uVar2 != 5) {
      return;
    }
    break;
  case 4:
    if (uVar2 != 6) {
      return;
    }
    break;
  case 5:
    if (1 < uVar2 - 3) {
      return;
    }
    break;
  case 6:
    if (uVar2 != 6) {
      return;
    }
LAB_0011f4c8:
    if (pxVar3->name == (char_t *)0x0) {
      return;
    }
    bVar1 = strequal(pxVar3->name,(this->_data).string);
LAB_0011f4dd:
    if (bVar1 == false) {
      return;
    }
    break;
  case 7:
    if (uVar2 != 2) {
      return;
    }
    break;
  case 8:
    if (uVar2 != 2) {
      return;
    }
    if (pxVar3->name == (char_t *)0x0) {
      return;
    }
    bVar1 = starts_with(pxVar3->name,(this->_data).string);
    goto LAB_0011f4dd;
  }
  xStack_28._attribute._attr = (xml_attribute_struct *)0x0;
  xStack_28._node._root = pxVar3;
  xpath_node_set_raw::push_back(ns,&xStack_28,alloc);
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}